

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbi_write_png(char *filename,int x,int y,int comp,void *data,int stride_bytes)

{
  uchar *__ptr;
  FILE *__s;
  uint uVar1;
  int len;
  int local_1c;
  
  __ptr = stbi_write_png_to_mem((uchar *)data,stride_bytes,x,y,comp,&local_1c);
  if (__ptr == (uchar *)0x0) {
    uVar1 = 0;
  }
  else {
    __s = fopen(filename,"wb");
    if (__s != (FILE *)0x0) {
      fwrite(__ptr,1,(long)local_1c,__s);
      fclose(__s);
    }
    uVar1 = (uint)(__s != (FILE *)0x0);
    free(__ptr);
  }
  return uVar1;
}

Assistant:

STBIWDEF int stbi_write_png(char const *filename, int x, int y, int comp,
                            const void *data, int stride_bytes) {
  FILE *f;
  int len;
  unsigned char *png = stbi_write_png_to_mem((unsigned char *)data,
                                             stride_bytes, x, y, comp, &len);
  if (png == NULL) return 0;
#ifdef STBI_MSC_SECURE_CRT
  if (fopen_s(&f, filename, "wb")) f = NULL;
#else
  f = fopen(filename, "wb");
#endif
  if (!f) {
    STBIW_FREE(png);
    return 0;
  }
  fwrite(png, 1, len, f);
  fclose(f);
  STBIW_FREE(png);
  return 1;
}